

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cc
# Opt level: O0

void __thiscall test_apply_endian_swap::test_method(test_apply_endian_swap *this)

{
  Value out;
  Value in;
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  short sVar4;
  int iVar5;
  PluginManager *pPVar6;
  pointer pIVar7;
  lazy_ostream *plVar8;
  Type *pTVar9;
  float fVar10;
  int local_101c;
  basic_cstring<const_char> local_1018;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1008;
  basic_cstring<const_char> local_fe0;
  basic_cstring<const_char> local_fd0;
  int local_fbc;
  int local_fb8;
  int j_1;
  int i_3;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_fa0;
  basic_cstring<const_char> local_f78;
  basic_cstring<const_char> local_f68;
  float local_f54;
  basic_cstring<const_char> local_f50;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f40;
  basic_cstring<const_char> local_f18;
  basic_cstring<const_char> local_f08;
  int local_ef8;
  undefined4 local_ef4;
  int i_2;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ee0;
  basic_cstring<const_char> local_eb8;
  basic_cstring<const_char> local_ea8;
  undefined1 local_e91;
  basic_cstring<const_char> local_e90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e80;
  basic_cstring<const_char> local_e58;
  basic_cstring<const_char> local_e48;
  undefined4 local_e34;
  basic_cstring<const_char> local_e30;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e20;
  basic_cstring<const_char> local_df8;
  basic_cstring<const_char> local_de8;
  undefined4 local_dd4;
  basic_cstring<const_char> local_dd0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_dc0;
  basic_cstring<const_char> local_d98;
  basic_cstring<const_char> local_d88;
  void *local_d78;
  void *pvStack_d70;
  void *local_d68;
  void *pvStack_d60;
  CompileEndianSwapVisitor local_d50 [8];
  CompileEndianSwapVisitor compiled;
  allocator local_d21;
  string local_d20 [32];
  undefined1 auStack_d00 [8];
  Value v_swapped_b;
  B swapped_b;
  string local_7b8 [32];
  undefined1 auStack_798 [8];
  Value v_b;
  int local_780;
  int j;
  int i_1;
  int i;
  B b;
  A a;
  basic_cstring<const_char> local_1d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[169],_const_char_(&)[169]> local_1c0;
  assertion_result local_1a0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  allocator local_161;
  string local_160 [32];
  config_set local_140 [8];
  config_set config;
  allocator local_d1;
  string local_d0 [32];
  unique_ptr<Typelib::Importer,_std::default_delete<Typelib::Importer>_> local_b0;
  unique_ptr<Typelib::Importer,_std::default_delete<Typelib::Importer>_> importer;
  use<Typelib::PluginManager> local_91;
  Registry local_90 [7];
  self manager;
  Registry registry;
  test_apply_endian_swap *this_local;
  
  Typelib::Registry::Registry(local_90);
  utilmm::singleton::use<Typelib::PluginManager>::use(&local_91);
  pPVar6 = utilmm::singleton::use<Typelib::PluginManager>::operator->(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"tlb",&local_d1);
  pIVar7 = (pointer)Typelib::PluginManager::importer((string *)pPVar6);
  std::unique_ptr<Typelib::Importer,std::default_delete<Typelib::Importer>>::
  unique_ptr<std::default_delete<Typelib::Importer>,void>
            ((unique_ptr<Typelib::Importer,std::default_delete<Typelib::Importer>> *)&local_b0,
             pIVar7);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  utilmm::config_set::config_set(local_140,(config_set *)0x0);
  do {
    pIVar7 = std::unique_ptr<Typelib::Importer,_std::default_delete<Typelib::Importer>_>::operator->
                       (&local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_cimport.tlb"
               ,&local_161);
    (**(code **)(*(long *)pIVar7 + 0x18))(pIVar7,local_160,local_140,local_90);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_178,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                 ,0x66);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0xf4,&local_188);
      boost::test_tools::assertion_result::assertion_result(&local_1a0,true);
      plVar8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_1c0,plVar8,
                 (char (*) [169])
                 "no exceptions thrown by importer->load(\"/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/\" \"test_cimport.tlb\", config, registry)"
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                 ,0x66);
      boost::test_tools::tt_detail::report_assertion(&local_1a0,&local_1c0,&local_1d0,0xf4,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[169],_const_char_(&)[169]>::
      ~lazy_ostream_impl(&local_1c0);
      boost::test_tools::assertion_result::~assertion_result(&local_1a0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  b._1320_8_ = Typelib::Endian::swap<long_long>(10);
  iVar5 = Typelib::Endian::swap<int>(0x14);
  a.a._0_4_ = iVar5;
  cVar3 = Typelib::Endian::swap<char>('b');
  a.a._4_1_ = cVar3;
  sVar4 = Typelib::Endian::swap<short>(0x34);
  a.a._6_2_ = sVar4;
  i_1 = (int)b.z;
  i = b._1324_4_;
  b.a.a = a.a;
  for (j = 0; j < 10; j = j + 1) {
    fVar10 = Typelib::Endian::swap<float>((float)j / 10.0);
    b.c[(long)j + -2] = fVar10;
  }
  b.c[0x62] = Typelib::Endian::swap<float>(42.0);
  for (local_780 = 0; local_780 < 10; local_780 = local_780 + 1) {
    for (v_b.m_type.t_._4_4_ = 0; v_b.m_type.t_._4_4_ < 10;
        v_b.m_type.t_._4_4_ = v_b.m_type.t_._4_4_ + 1) {
      fVar10 = Typelib::Endian::swap<float>((float)(local_780 * 100 + v_b.m_type.t_._4_4_));
      b.i[(long)local_780 + -1][(long)v_b.m_type.t_._4_4_ + 0x12] = fVar10;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b8,"/B",(allocator *)&swapped_b.field_0x52f);
  pTVar9 = (Type *)Typelib::Registry::get((string *)local_90);
  Typelib::Value::Value((Value *)auStack_798,&i_1,pTVar9);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&swapped_b.field_0x52f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"/B",&local_d21);
  pTVar9 = (Type *)Typelib::Registry::get((string *)local_90);
  Typelib::Value::Value((Value *)auStack_d00,&v_swapped_b.m_type,pTVar9);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  Typelib::CompileEndianSwapVisitor::CompileEndianSwapVisitor(local_d50);
  Typelib::Value::getType((Value *)auStack_798);
  Typelib::CompileEndianSwapVisitor::apply((Type *)local_d50);
  local_d68 = (void *)auStack_798;
  pvStack_d60 = v_b.m_data;
  local_d78 = (void *)auStack_d00;
  pvStack_d70 = v_swapped_b.m_data;
  in.m_type.t_ = (Type *)v_b.m_data;
  in.m_data = (void *)auStack_798;
  out.m_type.t_ = (Type *)v_swapped_b.m_data;
  out.m_data = (void *)auStack_d00;
  Typelib::CompileEndianSwapVisitor::swap(local_d50,in,out);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d98);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d88,0x10f,&local_d98);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_dc0,plVar8,(char (*) [1])0x1d88f5);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    local_dd4 = 10;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
              (&local_dc0,&local_dd0,0x10f,2,2,&local_dd4,"10",&v_swapped_b.m_type,"swapped_b.a.a");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_dc0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_df8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_de8,0x110,&local_df8);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e20,plVar8,(char (*) [1])0x1d88f5);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e30,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    local_e34 = 0x14;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e20,&local_e30,0x110,2,2,&local_e34,"20",&swapped_b,"swapped_b.a.b");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e20);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e48,0x111,&local_e58);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e80,plVar8,(char (*) [1])0x1d88f5);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    local_e91 = 0x62;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (&local_e80,&local_e90,0x111,2,2,&local_e91,"\'b\'",
               (undefined1 *)((long)&swapped_b.a.a + 4),"swapped_b.a.c");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_eb8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ea8,0x112,&local_eb8);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ee0,plVar8,(char (*) [1])0x1d88f5);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&i_2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    local_ef4 = 0x34;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,short>
              (&local_ee0,&i_2,0x112,2,2,&local_ef4,"52",(undefined1 *)((long)&swapped_b.a.a + 6),
               "swapped_b.a.d");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ee0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (local_ef8 = 0; local_ef8 < 10; local_ef8 = local_ef8 + 1) {
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f08,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                 ,0x66);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f18);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f08,0x114,&local_f18);
      plVar8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_f40,plVar8,(char (*) [1])0x1d88f5);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f50,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                 ,0x66);
      local_f54 = (float)local_ef8 / 10.0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
                (&local_f40,&local_f50,0x114,2,2,&local_f54,"static_cast<float>(i) / 10.0f",
                 swapped_b.c + (long)local_ef8 + -2,"swapped_b.c[i]");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_f40);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f68,0x115,&local_f78);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_fa0,plVar8,(char (*) [1])0x1d88f5);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&i_3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
               ,0x66);
    j_1 = 0x2a;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,float>
              (&local_fa0,&i_3,0x115,2,2,&j_1,"42",swapped_b.c + 0x62,"swapped_b.d[0]");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_fa0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (local_fb8 = 0; local_fb8 < 10; local_fb8 = local_fb8 + 1) {
    for (local_fbc = 0; local_fbc < 10; local_fbc = local_fbc + 1) {
      do {
        uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_fd0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                   ,0x66);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fe0);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_fd0,0x118,&local_fe0);
        plVar8 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<(&local_1008,plVar8,(char (*) [1])0x1d88f5);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_1018,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
                   ,0x66);
        local_101c = local_fb8 * 100 + local_fbc;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,float>
                  (&local_1008,&local_1018,0x118,2,2,&local_101c,"i * 100 + j",
                   swapped_b.i[(long)local_fb8 + -1] + (long)local_fbc + 0x12,"swapped_b.i[i][j]");
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl(&local_1008);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
  }
  Typelib::CompileEndianSwapVisitor::~CompileEndianSwapVisitor(local_d50);
  utilmm::config_set::~config_set(local_140);
  std::unique_ptr<Typelib::Importer,_std::default_delete<Typelib::Importer>_>::~unique_ptr
            (&local_b0);
  utilmm::singleton::use<Typelib::PluginManager>::~use(&local_91);
  Typelib::Registry::~Registry(local_90);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_apply_endian_swap )
{
    // Get the test file into repository
    Registry registry;
    PluginManager::self manager;
    unique_ptr<Importer> importer(manager->importer("tlb"));
    utilmm::config_set config;
    BOOST_REQUIRE_NO_THROW( importer->load(TEST_DATA_PATH("test_cimport.tlb"), config, registry) );

    A a = {
        Endian::swap((long long)10),
        Endian::swap((int)20),
        Endian::swap('b'),
        Endian::swap((short)52)
    };
    B b;
    b.a = a;
    for (int i = 0; i < 10; ++i)
        b.c[i] = Endian::swap(static_cast<float>(i) / 10.0f);

    b.d[0] = Endian::swap<float>(42);

    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            b.i[i][j] = Endian::swap<float>(i * 100 + j);

    Value v_b(&b, *registry.get("/B"));
    B swapped_b;
    Value v_swapped_b(&swapped_b, *registry.get("/B"));

    CompileEndianSwapVisitor compiled;
    compiled.apply(v_b.getType());
    compiled.swap(v_b, v_swapped_b);

    BOOST_REQUIRE_EQUAL(10, swapped_b.a.a);
    BOOST_REQUIRE_EQUAL(20, swapped_b.a.b);
    BOOST_REQUIRE_EQUAL('b', swapped_b.a.c);
    BOOST_REQUIRE_EQUAL(52, swapped_b.a.d);
    for (int i = 0; i < 10; ++i)
        BOOST_REQUIRE_EQUAL(static_cast<float>(i) / 10.0f, swapped_b.c[i]);
    BOOST_REQUIRE_EQUAL(42, swapped_b.d[0]);
    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            BOOST_REQUIRE_EQUAL(i * 100 + j, swapped_b.i[i][j]);
}